

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

bool __thiscall
MinVR::VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>::pop
          (VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1> *this)

{
  list<int,_std::allocator<int>_> *in_RDI;
  
  *(int *)((long)&in_RDI[4].super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                  super__List_node_base._M_next + 4) =
       *(int *)((long)&in_RDI[4].super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                       super__List_node_base._M_next + 4) + -1;
  if ((((ulong)in_RDI[4].super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
               super__List_node_base._M_next & 0x100) != 0) &&
     (0 < *(int *)((long)&in_RDI[4].super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                          super__List_node_base._M_next + 4))) {
    std::__cxx11::list<int,_std::allocator<int>_>::pop_front(in_RDI);
    std::__cxx11::
    list<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::pop_front((list<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)in_RDI);
    *(undefined1 *)
     ((long)&in_RDI[4].super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
             super__List_node_base._M_next + 1) = 0;
  }
  return *(int *)((long)&in_RDI[4].super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                         super__List_node_base._M_next + 4) < 1;
}

Assistant:

bool pop() {
    stackFrame--;
    if (pushed && (stackFrame > 0)) {
      value.pop_front();
      attrList.pop_front();
      pushed = false;
    };
    // A value with a stackFrame zero or less should be cleaned up.
    // It would have been added to the data index in a context that no
    // longer exists.  Use the return value from this function to
    // indicate a datum should be cleaned up.
    return (stackFrame <= 0);
  }